

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

void __thiscall
ft::treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::rotateLeft
          (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this,node *x)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  treeNode<int> **pptVar3;
  
  ptVar1 = x->right;
  ptVar2 = ptVar1->left;
  x->right = ptVar2;
  if (ptVar2 != (this->m_tree).NIL) {
    ptVar2->parent = x;
  }
  ptVar2 = x->parent;
  ptVar1->parent = ptVar2;
  if ((this->m_tree).m_root == x) {
    pptVar3 = &(this->m_tree).m_root;
  }
  else if (ptVar2->left == x) {
    pptVar3 = &ptVar2->left;
  }
  else {
    if (ptVar2->right != x) goto LAB_001080da;
    pptVar3 = &ptVar2->right;
  }
  *pptVar3 = ptVar1;
LAB_001080da:
  ptVar1->left = x;
  x->parent = ptVar1;
  return;
}

Assistant:

void rotateLeft(node* x)
	{
		node*	y = x->right;

		x->right = y->left;
		if (y->left != this->NIL())
			y->left->parent = x;
		y->parent = x->parent;
		if (x == this->root())
			this->m_tree.m_root = y;
		else if (x == x->parent->left)
			x->parent->left = y;
		else if (x == x->parent->right)
			x->parent->right = y;
		y->left = x;
		x->parent = y;
	}